

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightLeSample> * __thiscall
pbrt::UniformInfiniteLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,UniformInfiniteLight *this,
          Point2f u1,Point2f u2,SampledWavelengths *lambda,Float time)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  float fVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar19 [64];
  undefined1 auVar21 [64];
  undefined1 auVar23 [56];
  undefined1 auVar22 [64];
  float fVar24;
  float fVar30;
  undefined8 in_XMM1_Qb;
  undefined1 auVar25 [16];
  float fVar29;
  float fVar32;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar31 [56];
  undefined1 auVar28 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  SampledSpectrum SVar41;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float local_68;
  undefined1 auVar20 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar19._8_56_ = in_register_00001208;
  auVar19._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  auVar26 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar19._0_16_,
                            SUB6416(ZEXT464(0x3f800000),0));
  auVar17._8_4_ = 0x80000000;
  auVar17._0_8_ = 0x8000000080000000;
  auVar17._12_4_ = 0x80000000;
  auVar10 = vxorps_avx512vl(auVar26,auVar17);
  auVar17 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar26,auVar26);
  auVar17 = vmaxss_avx(auVar17,ZEXT816(0) << 0x20);
  if (auVar17._0_4_ < 0.0) {
    auVar20._0_4_ = sqrtf(auVar17._0_4_);
    auVar20._4_60_ = extraout_var;
    auVar17 = auVar20._0_16_;
  }
  else {
    auVar17 = vsqrtss_avx(auVar17,auVar17);
  }
  auVar37 = vmovshdup_avx(auVar19._0_16_);
  fVar9 = auVar37._0_4_ * 6.2831855;
  fVar14 = cosf(fVar9);
  auVar21._0_4_ = sinf(fVar9);
  auVar21._4_60_ = extraout_var_00;
  local_c8 = u2.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_c4 = u2.super_Tuple2<pbrt::Point2,_float>.y;
  fStack_c0 = (float)in_XMM1_Qb;
  fStack_bc = (float)((ulong)in_XMM1_Qb >> 0x20);
  auVar11._0_4_ = local_c8 + local_c8;
  auVar11._4_4_ = fStack_c4 + fStack_c4;
  auVar11._8_4_ = fStack_c0 + fStack_c0;
  auVar11._12_4_ = fStack_bc + fStack_bc;
  auVar37._8_4_ = 0xbf800000;
  auVar37._0_8_ = 0xbf800000bf800000;
  auVar37._12_4_ = 0xbf800000;
  auVar11 = vaddps_avx512vl(auVar11,auVar37);
  auVar37 = vmovshdup_avx(auVar11);
  fVar15 = auVar11._0_4_;
  fVar9 = auVar37._0_4_;
  if ((fVar15 == 0.0) && (!NAN(fVar15))) {
    auVar37 = ZEXT816(0) << 0x40;
    if ((fVar9 == 0.0) && (!NAN(fVar9))) goto LAB_00359dea;
  }
  auVar12._8_4_ = 0x7fffffff;
  auVar12._0_8_ = 0x7fffffff7fffffff;
  auVar12._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx512vl(auVar11,auVar12);
  auVar37 = vshufps_avx(auVar12,auVar12,0xf5);
  bVar6 = auVar37._0_4_ < auVar12._0_4_;
  auVar13._0_4_ = fVar15 / fVar9;
  auVar13._4_12_ = auVar11._4_12_;
  auVar37 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar13,ZEXT416(0x3fc90fdb));
  fVar8 = (float)((uint)bVar6 * (int)((fVar9 / fVar15) * 0.7853982) + (uint)!bVar6 * auVar37._0_4_);
  fVar9 = (float)((uint)bVar6 * (int)fVar15 + (uint)!bVar6 * (int)fVar9);
  fVar15 = cosf(fVar8);
  fVar8 = sinf(fVar8);
  auVar37 = vinsertps_avx(ZEXT416((uint)(fVar9 * fVar15)),ZEXT416((uint)(fVar9 * fVar8)),0x10);
LAB_00359dea:
  fVar9 = this->scale;
  fVar15 = this->sceneRadius;
  auVar25._8_4_ = 0x3f800000;
  auVar25._0_8_ = 0x3f8000003f800000;
  auVar25._12_4_ = 0x3f800000;
  auVar18._8_4_ = 0x80000000;
  auVar18._0_8_ = 0x8000000080000000;
  auVar18._12_4_ = 0x80000000;
  auVar11 = vpternlogd_avx512vl(auVar10,auVar25,auVar18,0xec);
  fVar14 = auVar17._0_4_ * fVar14;
  auVar40._0_4_ = -fVar14;
  auVar40._4_4_ = 0x80000000;
  auVar40._8_4_ = 0x80000000;
  auVar40._12_4_ = 0x80000000;
  local_68 = auVar26._0_4_;
  fVar39 = auVar11._0_4_;
  fVar16 = -1.0 / (fVar39 - local_68);
  uVar1 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x;
  uVar3 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y;
  auVar17 = vinsertps_avx(auVar11,auVar17,0x1c);
  auVar26 = vinsertps_avx(auVar40,auVar21._0_16_,0x1c);
  fVar24 = auVar17._0_4_ * auVar26._0_4_;
  fVar29 = auVar17._4_4_ * auVar26._4_4_;
  fVar30 = auVar17._8_4_ * auVar26._8_4_;
  fVar32 = auVar17._12_4_ * auVar26._12_4_;
  fVar36 = auVar37._0_4_;
  auVar26._0_4_ = fVar24 * fVar36;
  auVar26._4_4_ = fVar29 * auVar37._4_4_;
  auVar26._8_4_ = fVar30 * auVar37._8_4_;
  auVar26._12_4_ = fVar32 * auVar37._12_4_;
  auVar26 = vmovshdup_avx(auVar26);
  auVar31 = (undefined1  [56])0x0;
  fVar8 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z;
  auVar23 = (undefined1  [56])0x0;
  SVar41 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar28._0_8_ = SVar41.values.values._8_8_;
  auVar28._8_56_ = auVar31;
  auVar22._0_8_ = SVar41.values.values._0_8_;
  auVar22._8_56_ = auVar23;
  auVar17 = vmovlhps_avx(auVar22._0_16_,auVar28._0_16_);
  auVar7._4_4_ = fVar29;
  auVar7._0_4_ = fVar24;
  auVar7._8_4_ = fVar30;
  auVar7._12_4_ = fVar32;
  auVar10 = vmovshdup_avx(auVar7);
  fVar4 = fVar16 * fVar14 * auVar10._0_4_;
  auVar12 = vpermi2ps_avx512vl(_DAT_02875000,ZEXT416((uint)(fVar39 * fVar4)),ZEXT416((uint)fVar4));
  auVar10 = vshufps_avx(auVar37,auVar37,0xe1);
  auVar33._0_4_ = fVar24 * auVar40._0_4_;
  auVar33._4_4_ = fVar29 * fVar29;
  auVar33._8_4_ = fVar30 * fVar30;
  auVar33._12_4_ = fVar32 * fVar32;
  auVar35._4_4_ = fVar16;
  auVar35._0_4_ = fVar16;
  auVar35._8_4_ = fVar16;
  auVar35._12_4_ = fVar16;
  auVar38._8_4_ = 0x3f800000;
  auVar38._0_8_ = 0x3f8000003f800000;
  auVar38._12_4_ = 0x3f800000;
  auVar11 = vunpcklps_avx(auVar38,auVar11);
  auVar11 = vfmadd231ps_fma(auVar11,auVar33,auVar35);
  auVar34._4_12_ = auVar7._4_12_;
  auVar34._0_4_ = fVar14;
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar13 = vmulps_avx512vl(auVar34,auVar5);
  auVar27._0_4_ =
       fVar15 * (auVar12._0_4_ * auVar10._0_4_ + fVar36 * auVar11._0_4_ + auVar13._0_4_) +
       (float)uVar1;
  auVar27._4_4_ =
       fVar15 * (auVar12._4_4_ * auVar10._4_4_ + auVar37._4_4_ * auVar11._4_4_ + auVar13._4_4_) +
       (float)uVar3;
  auVar27._8_4_ =
       fVar15 * (auVar12._8_4_ * auVar10._8_4_ + auVar37._8_4_ * auVar11._8_4_ + auVar13._8_4_) +
       0.0;
  auVar27._12_4_ =
       fVar15 * (auVar12._12_4_ * auVar10._12_4_ + auVar37._12_4_ * auVar11._12_4_ + auVar13._12_4_)
       + 0.0;
  auVar10._0_4_ = fVar14 * fVar15;
  auVar10._4_4_ = fVar29 * fVar15;
  auVar10._8_4_ = fVar30 * fVar15;
  auVar10._12_4_ = fVar32 * fVar15;
  auVar10 = vsubps_avx(auVar27,auVar10);
  __return_storage_ptr__->set = true;
  *(float *)&__return_storage_ptr__->optionalValue = auVar17._0_4_ * fVar9;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 4) = auVar17._4_4_ * fVar9;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = auVar17._8_4_ * fVar9;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = auVar17._12_4_ * fVar9;
  uVar2 = vmovlps_avx(auVar10);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
       (fVar15 * (fVar39 * fVar14 * fVar36 + auVar26._0_4_ + local_68 * -0.0) + fVar8) -
       local_68 * fVar15;
  uVar2 = vmovlps_avx(auVar34);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar2;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) = local_68;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = time;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  (__return_storage_ptr__->optionalValue).__data[0x88] = '\0';
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x90) =
       1.0 / (fVar15 * fVar15 * 3.1415927);
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x94) = 0x3da2f983;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> UniformInfiniteLight::SampleLe(Point2f u1, Point2f u2,
                                                             SampledWavelengths &lambda,
                                                             Float time) const {
    // Sample direction for uniform infinite light ray
    Vector3f w = SampleUniformSphere(u1);

    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    // Compute probabilities for uniform infinite light
    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));
    Float pdfDir = UniformSpherePDF();

    return LightLeSample(scale * Lemit.Sample(lambda), ray, pdfPos, pdfDir);
}